

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

nh_bucstatus get_autopickup_buc(nh_bucstatus cur)

{
  wchar_t wVar1;
  wchar_t local_560 [2];
  wchar_t selected [1];
  wchar_t n;
  nh_menuitem items [5];
  nh_bucstatus local_c;
  nh_bucstatus cur_local;
  
  memcpy(selected,&DAT_00125fb0,0x53c);
  wVar1 = curses_display_menu((nh_menuitem_conflict *)selected,L'\x05',"Beatitude match:",L'\x01',
                              local_560);
  local_c = cur;
  if (L'\0' < wVar1) {
    local_c = local_560[0] + L'\xffffffff';
  }
  return local_c;
}

Assistant:

static enum nh_bucstatus get_autopickup_buc(enum nh_bucstatus cur)
{
    struct nh_menuitem items[] = {
	{B_DONT_CARE + 1,MI_NORMAL, "all", 'a'},
	{B_BLESSED + 1,	MI_NORMAL, "blessed", 'b'},
	{B_CURSED + 1,	MI_NORMAL, "cursed", 'c'},
	{B_UNCURSED + 1,MI_NORMAL, "uncursed", 'u'},
	{B_UNKNOWN + 1,	MI_NORMAL, "unknown", 'U'}
    };
    int n, selected[1];
    n = curses_display_menu(items, 5, "Beatitude match:", PICK_ONE, selected);
    if (n <= 0)
	return cur;
    return selected[0]-1;
}